

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O1

void UpdateCoins(CTransaction *tx,CCoinsViewCache *inputs,CTxUndo *txundo,int nHeight)

{
  long lVar1;
  pointer pCVar2;
  bool bVar3;
  pointer outpoint;
  vector<CTxIn,_std::allocator<CTxIn>_> *__range2;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar3 = CTransaction::IsCoinBase(tx);
  if (!bVar3) {
    std::vector<Coin,_std::allocator<Coin>_>::reserve
              (&txundo->vprevout,
               ((long)(tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3) * 0x4ec4ec4ec4ec4ec5);
    pCVar2 = (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (outpoint = (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                    super__Vector_impl_data._M_start; outpoint != pCVar2; outpoint = outpoint + 1) {
      std::vector<Coin,_std::allocator<Coin>_>::emplace_back<>(&txundo->vprevout);
      bVar3 = CCoinsViewCache::SpendCoin
                        (inputs,&outpoint->prevout,
                         (txundo->vprevout).super__Vector_base<Coin,_std::allocator<Coin>_>._M_impl.
                         super__Vector_impl_data._M_finish + -1);
      if (!bVar3) {
        __assert_fail("is_spent",
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
                      ,0x825,
                      "void UpdateCoins(const CTransaction &, CCoinsViewCache &, CTxUndo &, int)");
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    AddCoins(inputs,tx,nHeight,false);
    return;
  }
  __stack_chk_fail();
}

Assistant:

void UpdateCoins(const CTransaction& tx, CCoinsViewCache& inputs, CTxUndo &txundo, int nHeight)
{
    // mark inputs spent
    if (!tx.IsCoinBase()) {
        txundo.vprevout.reserve(tx.vin.size());
        for (const CTxIn &txin : tx.vin) {
            txundo.vprevout.emplace_back();
            bool is_spent = inputs.SpendCoin(txin.prevout, &txundo.vprevout.back());
            assert(is_spent);
        }
    }
    // add outputs
    AddCoins(inputs, tx, nHeight);
}